

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::UberMaterial::writeTo(UberMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  int32_t local_ac;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->kd);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_28,&(this->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_ac = BinaryWriter::serialize(binary,(SP *)local_28);
  BinaryWriter::write<int>(binary,&local_ac);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->ks);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_38,&(this->map_ks).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_ac = BinaryWriter::serialize(binary,(SP *)local_38);
  BinaryWriter::write<int>(binary,&local_ac);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->kr);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_48,&(this->map_kr).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_ac = BinaryWriter::serialize(binary,(SP *)local_48);
  BinaryWriter::write<int>(binary,&local_ac);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->kt);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_58,&(this->map_kt).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_ac = BinaryWriter::serialize(binary,(SP *)local_58);
  BinaryWriter::write<int>(binary,&local_ac);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->opacity);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_68,&(this->map_opacity).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_ac = BinaryWriter::serialize(binary,(SP *)local_68);
  BinaryWriter::write<int>(binary,&local_ac);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  BinaryWriter::write<float>(binary,&this->alpha);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_78,&(this->map_alpha).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_ac = BinaryWriter::serialize(binary,(SP *)local_78);
  BinaryWriter::write<int>(binary,&local_ac);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  BinaryWriter::write<float>(binary,&this->shadowAlpha);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_88,&(this->map_shadowAlpha).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_ac = BinaryWriter::serialize(binary,(SP *)local_88);
  BinaryWriter::write<int>(binary,&local_ac);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  BinaryWriter::write<float>(binary,&this->index);
  BinaryWriter::write<float>(binary,&this->roughness);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_98,&(this->map_roughness).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_ac = BinaryWriter::serialize(binary,(SP *)local_98);
  BinaryWriter::write<int>(binary,&local_ac);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_a8,&(this->map_bump).
                       super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
  local_ac = BinaryWriter::serialize(binary,(SP *)local_a8);
  BinaryWriter::write<int>(binary,&local_ac);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  return 0xc;
}

Assistant:

int UberMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(kd);
    binary.write(binary.serialize(map_kd));
    binary.write(ks);
    binary.write(binary.serialize(map_ks));
    binary.write(kr);
    binary.write(binary.serialize(map_kr));
    binary.write(kt);
    binary.write(binary.serialize(map_kt));
    binary.write(opacity);
    binary.write(binary.serialize(map_opacity));
    binary.write(alpha);
    binary.write(binary.serialize(map_alpha));
    binary.write(shadowAlpha);
    binary.write(binary.serialize(map_shadowAlpha));
    binary.write(index);
    binary.write(roughness);
    binary.write(binary.serialize(map_roughness));
    binary.write(binary.serialize(map_bump));
    return TYPE_UBER_MATERIAL;
  }